

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

void evthread_debug_lock_mark_unlocked(uint mode,debug_lock *lock)

{
  unsigned_long uVar1;
  unsigned_long me;
  debug_lock *lock_local;
  uint mode_local;
  
  if (lock->signature != 0xdeb0b10c) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0x10d,"DEBUG_LOCK_SIG == lock->signature","evthread_debug_lock_mark_unlocked");
  }
  if ((lock->locktype & 2) == 0) {
    if ((mode & 0xc) != 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x111,"(mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0",
                 "evthread_debug_lock_mark_unlocked");
    }
  }
  else if ((mode & 0xc) == 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0x10f,"mode & (EVTHREAD_READ|EVTHREAD_WRITE)","evthread_debug_lock_mark_unlocked");
  }
  if (evthread_id_fn_ != (_func_unsigned_long *)0x0) {
    uVar1 = (*evthread_id_fn_)();
    if (lock->held_by != uVar1) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x115,"lock->held_by == me","evthread_debug_lock_mark_unlocked");
    }
    if (lock->count == 1) {
      lock->held_by = 0;
    }
  }
  lock->count = lock->count + -1;
  if (-1 < lock->count) {
    return;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,0x11a,"lock->count >= 0","evthread_debug_lock_mark_unlocked");
}

Assistant:

static void
evthread_debug_lock_mark_unlocked(unsigned mode, struct debug_lock *lock)
{
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	if (lock->locktype & EVTHREAD_LOCKTYPE_READWRITE)
		EVUTIL_ASSERT(mode & (EVTHREAD_READ|EVTHREAD_WRITE));
	else
		EVUTIL_ASSERT((mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0);
	if (evthread_id_fn_) {
		unsigned long me;
		me = evthread_id_fn_();
		EVUTIL_ASSERT(lock->held_by == me);
		if (lock->count == 1)
			lock->held_by = 0;
	}
	--lock->count;
	EVUTIL_ASSERT(lock->count >= 0);
}